

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void RemoveAllFilesInList(void)

{
  if (FileNameList == (NameListEntry *)0x0) {
    return;
  }
  RemoveAllFilesInList_cold_1();
  return;
}

Assistant:

static void RemoveAllFilesInList(void)
{
    while (FileNameList)
    {
        struct NameListEntry *Next = FileNameList->Next;
        fprintf(stderr, "SST stream open at exit, unlinking contact file %s\n",
                FileNameList->FileName);
        unlink(FileNameList->FileName);
        free(FileNameList);
        FileNameList = Next;
    }
}